

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimal.cpp
# Opt level: O0

void castRay(RTCScene scene,float ox,float oy,float oz,float dx,float dy,float dz)

{
  undefined8 in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  RTCRayHit rayhit;
  undefined1 local_88 [12];
  undefined4 local_7c;
  float local_68;
  undefined4 local_64;
  undefined4 local_5c;
  uint local_44;
  uint local_40;
  undefined4 local_3c;
  float local_14;
  float local_10;
  float local_c;
  undefined8 local_8;
  
  local_7c = 0;
  local_14 = in_XMM2_Da;
  local_10 = in_XMM1_Da;
  local_c = in_XMM0_Da;
  local_8 = in_RDI;
  local_68 = std::numeric_limits<float>::infinity();
  local_64 = 0xffffffff;
  local_5c = 0;
  local_40 = 0xffffffff;
  local_3c = 0xffffffff;
  rtcIntersect1(local_8,local_88,0);
  printf("%f, %f, %f: ",(double)local_c,(double)local_10,(double)local_14);
  if (local_40 == 0xffffffff) {
    printf("Did not find any intersection.\n");
  }
  else {
    printf("Found intersection on geometry %d, primitive %d at tfar=%f\n",(double)local_68,
           (ulong)local_40,(ulong)local_44);
  }
  return;
}

Assistant:

void castRay(RTCScene scene,
             float ox, float oy, float oz,
             float dx, float dy, float dz)
{
  /*
   * The ray hit structure holds both the ray and the hit.
   * The user must initialize it properly -- see API documentation
   * for rtcIntersect1() for details.
   */
  struct RTCRayHit rayhit;
  rayhit.ray.org_x = ox;
  rayhit.ray.org_y = oy;
  rayhit.ray.org_z = oz;
  rayhit.ray.dir_x = dx;
  rayhit.ray.dir_y = dy;
  rayhit.ray.dir_z = dz;
  rayhit.ray.tnear = 0;
  rayhit.ray.tfar = std::numeric_limits<float>::infinity();
  rayhit.ray.mask = -1;
  rayhit.ray.flags = 0;
  rayhit.hit.geomID = RTC_INVALID_GEOMETRY_ID;
  rayhit.hit.instID[0] = RTC_INVALID_GEOMETRY_ID;

  /*
   * There are multiple variants of rtcIntersect. This one
   * intersects a single ray with the scene.
   */
  rtcIntersect1(scene, &rayhit);

  printf("%f, %f, %f: ", ox, oy, oz);
  if (rayhit.hit.geomID != RTC_INVALID_GEOMETRY_ID)
  {
    /* Note how geomID and primID identify the geometry we just hit.
     * We could use them here to interpolate geometry information,
     * compute shading, etc.
     * Since there is only a single triangle in this scene, we will
     * get geomID=0 / primID=0 for all hits.
     * There is also instID, used for instancing. See
     * the instancing tutorials for more information */
    printf("Found intersection on geometry %d, primitive %d at tfar=%f\n", 
           rayhit.hit.geomID,
           rayhit.hit.primID,
           rayhit.ray.tfar);
  }
  else
    printf("Did not find any intersection.\n");
}